

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

arith_uint256 *
CalculateClaimedHeadersWork(span<const_CBlockHeader,_18446744073709551615UL> headers)

{
  bool bVar1;
  CBlockHeader *in_RDI;
  long in_FS_OFFSET;
  CBlockHeader *header;
  span<const_CBlockHeader,_18446744073709551615UL> *__range1;
  arith_uint256 *total_work;
  iterator __end1;
  iterator __begin1;
  CBlockIndex dummy;
  CBlockHeader *block;
  CBlockIndex *in_stack_ffffffffffffff08;
  base_uint<256U> *b;
  CBlockHeader *this;
  base_uint<256U> local_d0 [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  block = in_RDI;
  this = in_RDI;
  arith_uint256::arith_uint256((arith_uint256 *)in_RDI,0x149e7b0);
  b = local_d0;
  std::span<const_CBlockHeader,_18446744073709551615UL>::begin
            ((span<const_CBlockHeader,_18446744073709551615UL> *)block);
  std::span<const_CBlockHeader,_18446744073709551615UL>::end
            ((span<const_CBlockHeader,_18446744073709551615UL> *)in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_CBlockHeader_*,_std::span<const_CBlockHeader,_18446744073709551615UL>_>
                      ((__normal_iterator<const_CBlockHeader_*,_std::span<const_CBlockHeader,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff08,
                       (__normal_iterator<const_CBlockHeader_*,_std::span<const_CBlockHeader,_18446744073709551615UL>_>
                        *)block);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffff08 =
         (CBlockIndex *)
         __gnu_cxx::
         __normal_iterator<const_CBlockHeader_*,_std::span<const_CBlockHeader,_18446744073709551615UL>_>
         ::operator*((__normal_iterator<const_CBlockHeader_*,_std::span<const_CBlockHeader,_18446744073709551615UL>_>
                      *)in_RDI);
    CBlockIndex::CBlockIndex(in_stack_ffffffffffffff08,block);
    GetBlockProof(in_stack_ffffffffffffff08);
    base_uint<256U>::operator+=((base_uint<256U> *)this,b);
    __gnu_cxx::
    __normal_iterator<const_CBlockHeader_*,_std::span<const_CBlockHeader,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_CBlockHeader_*,_std::span<const_CBlockHeader,_18446744073709551615UL>_>
                  *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (arith_uint256 *)block;
  }
  __stack_chk_fail();
}

Assistant:

arith_uint256 CalculateClaimedHeadersWork(std::span<const CBlockHeader> headers)
{
    arith_uint256 total_work{0};
    for (const CBlockHeader& header : headers) {
        CBlockIndex dummy(header);
        total_work += GetBlockProof(dummy);
    }
    return total_work;
}